

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::createNoResultOp
          (Builder *this,Op opCode,vector<unsigned_int,_std::allocator<unsigned_int>_> *operands)

{
  Id *pIVar1;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  size_type __n;
  Id *pIVar2;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       operator_new(0x60);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_0093fd28;
  *(undefined8 *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = 0;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = opCode;
  (((_Bit_iterator *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  (((vector<bool,_std::allocator<bool>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
  super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
  *(_Bit_pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) = (_Bit_pointer)0x0
  ;
  *(Block **)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
  __n = (long)(operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),__n);
  std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)
             ((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),__n);
  pIVar1 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pIVar2 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,*pIVar2);
  }
  local_30._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_30);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Builder::createNoResultOp(Op opCode, const std::vector<Id>& operands)
{
    Instruction* op = new Instruction(opCode);
    op->reserveOperands(operands.size());
    for (auto id : operands) {
        op->addIdOperand(id);
    }
    addInstruction(std::unique_ptr<Instruction>(op));
}